

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageChannel.h
# Opt level: O1

DeepSlice * __thiscall
Imf_2_5::TypedDeepImageChannel<unsigned_int>::slice
          (DeepSlice *__return_storage_ptr__,TypedDeepImageChannel<unsigned_int> *this)

{
  PixelType t;
  
  t = (**(this->super_DeepImageChannel).super_ImageChannel._vptr_ImageChannel)(this);
  DeepSlice::DeepSlice
            (__return_storage_ptr__,t,(char *)this->_base,8,
             (long)(this->super_DeepImageChannel).super_ImageChannel._pixelsPerRow << 3,4,
             (this->super_DeepImageChannel).super_ImageChannel._xSampling,
             (this->super_DeepImageChannel).super_ImageChannel._ySampling,0.0,false,false);
  return __return_storage_ptr__;
}

Assistant:

DeepSlice
TypedDeepImageChannel<T>::slice () const
{
    return DeepSlice (pixelType(),                  // type
                      (char *) _base,               // base
                      sizeof (T*),                  // xStride
                      pixelsPerRow() * sizeof (T*), // yStride
                      sizeof (T),                   // sampleStride
                      xSampling(),
                      ySampling());
}